

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void update_perf_tbl_with_bapcod_json_perf_data
               (AppCtx *ctx,PerfProfRunHandle *handle,char *json_filepath)

{
  double dVar1;
  cJSON *root;
  PerfProfRun run;
  PerfProfRun local_70;
  
  dVar1 = ctx->current_batch->timelimit;
  strncpy(local_70.solver_name,handle->solver_name,0x30);
  local_70.solver_name[0x2f] = '\0';
  local_70.solution.stats[0] = dVar1 + dVar1;
  local_70.solution.status = SOLVE_STATUS_ERR;
  local_70.solution._4_4_ = 0;
  local_70.solution.stats[1] = 2.0;
  local_70.solution.stats[2] = 0.0;
  if (json_filepath != (char *)0x0) {
    root = load_json(json_filepath);
    if (root != (cJSON *)0x0) {
      parse_bapcod_solver_json_dump(&local_70,root);
      cJSON_Delete(root);
    }
  }
  store_perfprof_run(&ctx->perf_tbl,&(handle->input).uid,&local_70);
  return;
}

Assistant:

static void update_perf_tbl_with_bapcod_json_perf_data(
    AppCtx *ctx, PerfProfRunHandle *handle, char *json_filepath) {
    PerfProfRun run = make_solver_run(ctx->current_batch, handle->solver_name);
    if (json_filepath) {
        cJSON *root = load_json(json_filepath);
        if (root) {
            parse_bapcod_solver_json_dump(&run, root);
            cJSON_Delete(root);
        }
    }
    store_perfprof_run(&ctx->perf_tbl, &handle->input.uid, &run);
}